

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.cpp
# Opt level: O0

Type miniscript::internal::ComputeType
               (Fragment fragment,Type x,Type y,Type z,
               vector<miniscript::Type,_std::allocator<miniscript::Type>_> *sub_types,uint32_t k,
               size_t data_size,size_t n_subs,size_t n_keys,MiniscriptContext ms_ctx)

{
  long lVar1;
  Type x_00;
  Type x_01;
  Type x_02;
  Type x_03;
  Type x_04;
  Type x_05;
  Type x_06;
  Type x_07;
  Type x_08;
  Type x_09;
  Type x_10;
  Type x_11;
  Type x_12;
  Type x_13;
  Type x_14;
  Type x_15;
  Type x_16;
  Type x_17;
  Type x_18;
  Type x_19;
  Type x_20;
  Type x_21;
  Type x_22;
  Type x_23;
  Type x_24;
  Type x_25;
  Type x_26;
  Type x_27;
  Type x_28;
  Type x_29;
  Type x_30;
  Type x_31;
  Type x_32;
  Type x_33;
  Type x_34;
  Type x_35;
  Type x_36;
  Type x_37;
  Type x_38;
  Type x_39;
  Type x_40;
  Type x_41;
  Type x_42;
  Type x_43;
  Type x_44;
  Type x_45;
  Type x_46;
  Type x_47;
  Type x_48;
  Type x_49;
  Type x_50;
  Type x_51;
  Type x_52;
  Type x_53;
  Type x_54;
  Type x_55;
  Type x_56;
  Type x_57;
  Type x_58;
  Type x_59;
  Type x_60;
  Type x_61;
  Type x_62;
  Type x_63;
  Type x_64;
  Type x_65;
  Type x_66;
  Type x_67;
  Type x_68;
  Type x_69;
  Type x_70;
  Type x_71;
  Type x_72;
  Type x_73;
  Type x_74;
  Type x_75;
  Type x_76;
  Type x_77;
  Type x_78;
  Type x_79;
  Type x_80;
  Type x_81;
  Type x_82;
  Type x_83;
  Type x_84;
  Type x_85;
  Type x_86;
  Type x_87;
  Type x_88;
  Type x_89;
  Type x_90;
  Type x_91;
  Type x_92;
  Type x_93;
  Type x_94;
  Type x_95;
  Type x_96;
  Type x_97;
  Type x_98;
  Type x_99;
  Type x_x00100;
  Type x_x00101;
  Type x_x00102;
  Type x_x00103;
  Type x_x00104;
  Type x_x00105;
  Type x_x00106;
  Type x_x00107;
  Type x_x00108;
  Type x_x00109;
  Type x_x00110;
  Type x_x00111;
  Type x_x00112;
  Type x_x00113;
  Type x_x00114;
  Type x_x00115;
  Type x_x00116;
  Type x_x00117;
  Type x_x00118;
  Type x_x00119;
  Type x_x00120;
  Type x_x00121;
  Type x_x00122;
  Type x_x00123;
  Type x_x00124;
  Type x_x00125;
  Type x_x00126;
  Type x_x00127;
  Type x_x00128;
  Type x_x00129;
  Type x_x00130;
  Type x_x00131;
  Type x_x00132;
  Type x_x00133;
  Type x_x00134;
  Type x_x00135;
  Type x_x00136;
  Type x_x00137;
  Type x_x00138;
  Type x_x00139;
  Type x_x00140;
  Type x_x00141;
  Type x_x00142;
  Type x_x00143;
  Type x_x00144;
  Type x_x00145;
  Type x_x00146;
  Type x_x00147;
  Type x_x00148;
  Type x_x00149;
  Type x_x00150;
  Type x_x00151;
  Type x_x00152;
  Type x_x00153;
  Type x_x00154;
  Type x_x00155;
  Type x_x00156;
  Type x_x00157;
  Type x_x00158;
  Type x_x00159;
  Type x_x00160;
  Type x_x00161;
  Type x_x00162;
  Type x_x00163;
  Type x_x00164;
  Type x_x00165;
  Type x_x00166;
  Type x_x00167;
  Type x_x00168;
  Type x_x00169;
  Type x_x00170;
  Type x_x00171;
  Type x_x00172;
  Type x_x00173;
  Type x_x00174;
  Type x_x00175;
  Type x_x00176;
  Type x_x00177;
  Type x_x00178;
  Type x_x00179;
  Type x_x00180;
  Type x_x00181;
  Type x_x00182;
  Type x_x00183;
  Type x_x00184;
  Type x_x00185;
  Type x_x00186;
  Type x_x00187;
  Type x_x00188;
  Type x_x00189;
  Type x_x00190;
  Type x_x00191;
  Type x_x00192;
  Type x_x00193;
  Type x_x00194;
  Type x_x00195;
  Type x_x00196;
  Type x_x00197;
  Type x_x00198;
  Type x_x00199;
  Type x_x00200;
  Type x_x00201;
  Type x_x00202;
  Type x_x00203;
  Type x_x00204;
  Type x_x00205;
  Type x_x00206;
  Type x_x00207;
  Type x_x00208;
  Type x_x00209;
  Type x_x00210;
  Type x_x00211;
  Type x_x00212;
  Type x_x00213;
  Type x_x00214;
  Type x_x00215;
  Type x_x00216;
  Type x_x00217;
  Type x_x00218;
  Type x_x00219;
  Type x_x00220;
  Type x_x00221;
  Type x_x00222;
  Type x_x00223;
  Type x_x00224;
  Type x_x00225;
  Type x_x00226;
  Type x_x00227;
  Type x_x00228;
  Type x_x00229;
  Type x_x00230;
  Type x_x00231;
  Type x_x00232;
  Type x_x00233;
  Type x_x00234;
  Type x_x00235;
  Type x_x00236;
  Type x_x00237;
  Type x_x00238;
  Type x_x00239;
  Type x_x00240;
  Type x_x00241;
  Type x_x00242;
  Type x_x00243;
  Type x_x00244;
  Type x_x00245;
  Type x_x00246;
  Type x_x00247;
  Type x_x00248;
  Type x_x00249;
  Type x_x00250;
  Type x_x00251;
  Type x_x00252;
  Type x_x00253;
  Type x_x00254;
  Type x_x00255;
  Type x_x00256;
  Type x_x00257;
  Type x_x00258;
  Type x_x00259;
  Type x_x00260;
  Type x_x00261;
  Type x_x00262;
  Type x_x00263;
  Type x_x00264;
  Type x_x00265;
  Type x_x00266;
  Type x_x00267;
  Type x_x00268;
  Type x_x00269;
  Type x_x00270;
  Type x_x00271;
  Type x_x00272;
  Type x_x00273;
  Type x_x00274;
  Type x_x00275;
  Type x_x00276;
  Type x_x00277;
  Type x_x00278;
  Type x_x00279;
  Type x_x00280;
  Type x_x00281;
  Type x_x00282;
  Type x_x00283;
  Type x_x00284;
  Type x_x00285;
  Type x_x00286;
  Type x_x00287;
  Type x_x00288;
  Type x_x00289;
  Type x_x00290;
  Type x_x00291;
  Type x_x00292;
  Type x_x00293;
  Type x_x00294;
  Type x_x00295;
  Type x_x00296;
  Type x_x00297;
  Type x_x00298;
  Type x_x00299;
  Type x_x00300;
  Type x_x00301;
  Type x_x00302;
  Type x_x00303;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  int in_EDI;
  uint in_R9D;
  long in_FS_OFFSET;
  long in_stack_00000008;
  ulong in_stack_00000010;
  ulong in_stack_00000018;
  size_t i;
  uint32_t num_s;
  uint32_t args;
  bool all_m;
  bool all_e;
  Type t;
  Type acc_tl;
  MiniscriptContext in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  undefined4 in_stack_fffffffffffff790;
  undefined1 in_stack_fffffffffffff794;
  undefined1 in_stack_fffffffffffff795;
  undefined1 uVar6;
  undefined1 in_stack_fffffffffffff796;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffff797;
  undefined1 in_stack_fffffffffffff798;
  byte in_stack_fffffffffffff799;
  byte in_stack_fffffffffffff79a;
  undefined1 uVar8;
  int in_stack_fffffffffffff79b;
  undefined3 uVar9;
  uint3 uVar10;
  undefined1 in_stack_fffffffffffff79f;
  Type *in_stack_fffffffffffff7a0;
  bool local_825;
  ulong local_7d0;
  uint local_7c8;
  uint32_t local_430;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_EDI == 6) || (in_EDI == 7)) {
    if (in_stack_00000008 != 0x20) {
      __assert_fail("data_size == 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,0x28,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if ((in_EDI == 8) || (in_EDI == 9)) {
    if (in_stack_00000008 != 0x14) {
      __assert_fail("data_size == 20",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,0x2a,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (in_stack_00000008 != 0) {
    __assert_fail("data_size == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                  ,0x2c,
                  "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                 );
  }
  if ((in_EDI == 4) || (in_EDI == 5)) {
    local_825 = (int)in_R9D < 1;
    if (local_825) {
      __assert_fail("k >= 1 && k < 0x80000000UL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,0x30,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if ((in_EDI == 0x19) || (in_EDI == 0x1a)) {
    if (in_R9D == 0 || in_stack_00000018 < in_R9D) {
      __assert_fail("k >= 1 && k <= n_keys",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,0x32,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (in_EDI == 0x18) {
    if (in_R9D == 0 || in_stack_00000010 < in_R9D) {
      __assert_fail("k >= 1 && k <= n_subs",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,0x34,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (in_R9D != 0) {
    __assert_fail("k == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                  ,0x36,
                  "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                 );
  }
  if (((((in_EDI == 0x11) || (in_EDI == 0x12)) || (in_EDI == 0x13)) ||
      ((in_EDI == 0x14 || (in_EDI == 0x16)))) || (in_EDI == 0x15)) {
    if (in_stack_00000010 != 2) {
      __assert_fail("n_subs == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,0x3b,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (in_EDI == 0x17) {
    if (in_stack_00000010 != 3) {
      __assert_fail("n_subs == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,0x3d,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if ((((in_EDI == 10) || (in_EDI == 0xb)) ||
           ((in_EDI == 0xc || (((in_EDI == 0xd || (in_EDI == 0xe)) || (in_EDI == 0xf)))))) ||
          (in_EDI == 0x10)) {
    if (in_stack_00000010 != 1) {
      __assert_fail("n_subs == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,0x41,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if ((in_EDI != 0x18) && (in_stack_00000010 != 0)) {
    __assert_fail("n_subs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                  ,0x43,
                  "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                 );
  }
  if ((in_EDI == 2) || (in_EDI == 3)) {
    if (in_stack_00000018 != 1) {
      __assert_fail("n_keys == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,0x47,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (in_EDI == 0x19) {
    if (in_stack_00000018 == 0 || 0x14 < in_stack_00000018) {
      __assert_fail("n_keys >= 1 && n_keys <= MAX_PUBKEYS_PER_MULTISIG",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,0x49,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
    bVar3 = IsTapscript(in_stack_fffffffffffff788);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      __assert_fail("!IsTapscript(ms_ctx)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,0x4a,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (in_EDI == 0x1a) {
    if (in_stack_00000018 == 0 || 999 < in_stack_00000018) {
      __assert_fail("n_keys >= 1 && n_keys <= MAX_PUBKEYS_PER_MULTI_A",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,0x4c,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
    bVar3 = IsTapscript(in_stack_fffffffffffff788);
    if (!bVar3) {
      __assert_fail("IsTapscript(ms_ctx)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                    ,0x4d,
                    "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                   );
    }
  }
  else if (in_stack_00000018 != 0) {
    __assert_fail("n_keys == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                  ,0x4f,
                  "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                 );
  }
  uVar6 = (undefined1)in_stack_fffffffffffff79b;
  uVar9 = (undefined3)((uint)in_stack_fffffffffffff79b >> 8);
  switch(in_EDI) {
  case 0:
    local_430 = 0x43b91;
    break;
  case 1:
    local_430 = 0x43511;
    break;
  case 2:
    local_430 = 0x43be4;
    break;
  case 3:
    local_430 = 0x43bc4;
    break;
  case 4:
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_00.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_00.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_00.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_00.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_00);
    x_01.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_01.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_01.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_01.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_01);
    break;
  case 5:
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_02.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_02.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_02.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_02.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_02);
    x_03.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_03.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_03.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_03.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_03);
    break;
  case 6:
    local_430 = 0x411e1;
    break;
  case 7:
    local_430 = 0x411e1;
    break;
  case 8:
    local_430 = 0x411e1;
    break;
  case 9:
    local_430 = 0x411e1;
    break;
  case 10:
    x_x00217.m_flags._3_1_ = (bool)in_stack_fffffffffffff79f;
    x_x00217.m_flags._0_3_ = uVar9;
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00217);
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_04.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_04.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_04.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_04.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_04);
    x_05.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_05.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_05.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_05.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_05);
    x_06.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_06.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_06.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_06.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_06);
    x_07.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_07.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_07.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_07.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_07);
    x_08.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_08.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_08.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_08.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_08);
    break;
  case 0xb:
    x_x00218.m_flags._3_1_ = (bool)in_stack_fffffffffffff79f;
    x_x00218.m_flags._0_3_ = uVar9;
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00218);
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_09.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_09.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_09.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_09.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_09);
    x_10.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_10.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_10.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_10.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_10);
    x_11.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_11.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_11.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_11.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_11);
    x_12.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_12.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_12.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_12.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_12);
    break;
  case 0xc:
    x_x00219.m_flags._3_1_ = (bool)in_stack_fffffffffffff79f;
    x_x00219.m_flags._0_3_ = uVar9;
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00219);
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_13.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_13.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_13.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_13.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_13);
    x_14.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_14.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_14.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_14.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_14);
    x_15.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_15.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_15.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_15.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_15);
    x_16.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_16.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_16.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_16.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_16);
    x_17.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_17.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_17.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_17.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_17);
    break;
  case 0xd:
    x_x00220.m_flags._3_1_ = (bool)in_stack_fffffffffffff79f;
    x_x00220.m_flags._0_3_ = uVar9;
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00220);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00221.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00221.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00221);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_18.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_18.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_18.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_18.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_18);
    x_x00222.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00222.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00222);
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_19.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_19.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_19.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_19.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_19);
    x_20.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_20.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_20.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_20.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_20);
    x_21.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_21.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_21.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_21.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_21);
    x_22.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_22.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_22.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_22.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_22);
    x_23.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_23.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_23.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_23.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_23);
    IsTapscript(in_stack_fffffffffffff788);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_24.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_24.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_24.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_24.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_24);
    x_25.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_25.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_25.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_25.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_25);
    break;
  case 0xe:
    x_x00223.m_flags._3_1_ = (bool)in_stack_fffffffffffff79f;
    x_x00223.m_flags._0_3_ = uVar9;
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00223);
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_26.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_26.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_26.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_26.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_26);
    x_27.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_27.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_27.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_27.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_27);
    x_28.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_28.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_28.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_28.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_28);
    x_29.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_29.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_29.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_29.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_29);
    x_30.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_30.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_30.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_30.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_30);
    break;
  case 0xf:
    x_x00224.m_flags._3_1_ = (bool)in_stack_fffffffffffff79f;
    x_x00224.m_flags._0_3_ = uVar9;
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00224);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00225.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00225.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00225);
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_31.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_31.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_31.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_31.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_31);
    x_32.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_32.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_32.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_32.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_32);
    x_33.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_33.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_33.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_33.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_33);
    x_34.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_34.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_34.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_34.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_34);
    x_35.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_35.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_35.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_35.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_35);
    x_36.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_36.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_36.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_36.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_36);
    break;
  case 0x10:
    x_37.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_37.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_37.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_37.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_37);
    x_38.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_38.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_38.m_flags._2_1_ = in_stack_fffffffffffff79a;
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    x_38.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_38);
    x_39.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_39.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_39.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_39.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_39);
    x_40.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_40.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_40.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_40.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_40);
    break;
  case 0x11:
    x_41.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_41.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_41.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_41.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_41);
    x_x00226.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00226.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00226);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_42.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_42.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_42.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_42.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_42);
    x_43.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_43.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_43.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_43.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_43);
    x_44.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_44.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_44.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_44.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_44);
    x_x00227.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00227.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00227);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_45.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_45.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_45.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_45.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_45);
    x_46.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_46.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_46.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_46.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_46);
    x_47.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_47.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_47.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_47.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_47);
    x_48.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_48.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_48.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_48.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_48);
    x_x00228.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00228.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00228);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_49.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_49.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_49.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_49.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_49);
    x_50.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_50.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_50.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_50.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_50);
    x_51.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_51.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_51.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_51.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_51);
    x_52.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_52.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_52.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_52.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_52);
    x_53.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_53.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_53.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_53.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_53);
    x_54.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_54.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_54.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_54.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_54);
    x_55.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_55.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_55.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_55.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_55);
    x_x00229.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00229.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                              CONCAT16(in_stack_fffffffffffff796,
                                                       CONCAT15(in_stack_fffffffffffff795,
                                                                CONCAT14(in_stack_fffffffffffff794,
                                                                         in_stack_fffffffffffff790))
                                                      )),x_x00229);
    if (!bVar3) {
      x_x00230.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00230.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                        CONCAT16(in_stack_fffffffffffff796,
                                                 CONCAT15(in_stack_fffffffffffff795,
                                                          CONCAT14(in_stack_fffffffffffff794,
                                                                   in_stack_fffffffffffff790)))),
                       x_x00230);
    }
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_56.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_56.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_56.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_56.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_56);
    x_57.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_57.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_57.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_57.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_57);
    x_58.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_58.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_58.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_58.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_58);
    x_59.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_59.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_59.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_59.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_59);
    x_60.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_60.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_60.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_60.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_60);
    x_61.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_61.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_61.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_61.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_61);
    x_62.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_62.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_62.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_62.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_62);
    x_x00231.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00231.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                              CONCAT16(in_stack_fffffffffffff796,
                                                       CONCAT15(in_stack_fffffffffffff795,
                                                                CONCAT14(in_stack_fffffffffffff794,
                                                                         in_stack_fffffffffffff790))
                                                      )),x_x00231);
    if ((((bVar3) &&
         ((x_x00232.m_flags._3_1_ = in_stack_fffffffffffff79f,
          x_x00232.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
          bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                    CONCAT16(in_stack_fffffffffffff796,
                                                             CONCAT15(in_stack_fffffffffffff795,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00232), !bVar3 ||
          (x_x00233.m_flags._3_1_ = in_stack_fffffffffffff79f,
          x_x00233.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
          bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                    CONCAT16(in_stack_fffffffffffff796,
                                                             CONCAT15(in_stack_fffffffffffff795,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00233), !bVar3)))
         ) && ((x_x00234.m_flags._3_1_ = in_stack_fffffffffffff79f,
               x_x00234.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
               bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                         CONCAT16(in_stack_fffffffffffff796,
                                                                  CONCAT15(in_stack_fffffffffffff795
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00234), !bVar3 ||
               (x_x00235.m_flags._3_1_ = in_stack_fffffffffffff79f,
               x_x00235.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
               bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                         CONCAT16(in_stack_fffffffffffff796,
                                                                  CONCAT15(in_stack_fffffffffffff795
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00235), !bVar3)))
        ) && (((x_x00236.m_flags._3_1_ = in_stack_fffffffffffff79f,
               x_x00236.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
               bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                         CONCAT16(in_stack_fffffffffffff796,
                                                                  CONCAT15(in_stack_fffffffffffff795
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00236), !bVar3 ||
               (x_x00237.m_flags._3_1_ = in_stack_fffffffffffff79f,
               x_x00237.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
               bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                         CONCAT16(in_stack_fffffffffffff796,
                                                                  CONCAT15(in_stack_fffffffffffff795
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00237), !bVar3))
              && (x_x00238.m_flags._3_1_ = in_stack_fffffffffffff79f,
                 x_x00238.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
                 bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                           CONCAT16(in_stack_fffffffffffff796,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff795,
                                                  CONCAT14(in_stack_fffffffffffff794,
                                                           in_stack_fffffffffffff790)))),x_x00238),
                 bVar3)))) {
      x_x00239.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00239.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                        CONCAT16(in_stack_fffffffffffff796,
                                                 CONCAT15(in_stack_fffffffffffff795,
                                                          CONCAT14(in_stack_fffffffffffff794,
                                                                   in_stack_fffffffffffff790)))),
                       x_x00239);
    }
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_63.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_63.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_63.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_63.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_63);
    break;
  case 0x12:
    x_64.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_64.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_64.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_64.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_64);
    x_x00240.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00240.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00240);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_65.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_65.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_65.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_65.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_65);
    x_66.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_66.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_66.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_66.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_66);
    x_67.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_67.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_67.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_67.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_67);
    x_x00241.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00241.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00241);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_68.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_68.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_68.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_68.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_68);
    x_69.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_69.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_69.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_69.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_69);
    x_70.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_70.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_70.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_70.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_70);
    x_71.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_71.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_71.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_71.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_71);
    x_x00242.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00242.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00242);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_72.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_72.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_72.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_72.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_72);
    x_73.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_73.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_73.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_73.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_73);
    x_74.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_74.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_74.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_74.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_74);
    x_75.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_75.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_75.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_75.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_75);
    x_x00243.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00243.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00243);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_76.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_76.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_76.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_76.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_76);
    x_77.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_77.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_77.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_77.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_77);
    x_78.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_78.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_78.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_78.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_78);
    x_79.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_79.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_79.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_79.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_79);
    x_80.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_80.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_80.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_80.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_80);
    x_x00244.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00244.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                              CONCAT16(in_stack_fffffffffffff796,
                                                       CONCAT15(in_stack_fffffffffffff795,
                                                                CONCAT14(in_stack_fffffffffffff794,
                                                                         in_stack_fffffffffffff790))
                                                      )),x_x00244);
    if ((!bVar3) &&
       (x_x00245.m_flags._3_1_ = in_stack_fffffffffffff79f,
       x_x00245.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
       bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00245), !bVar3))
    {
      x_x00246.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00246.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                        CONCAT16(in_stack_fffffffffffff796,
                                                 CONCAT15(in_stack_fffffffffffff795,
                                                          CONCAT14(in_stack_fffffffffffff794,
                                                                   in_stack_fffffffffffff790)))),
                       x_x00246);
    }
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_81.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_81.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_81.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_81.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_81);
    x_82.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_82.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_82.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_82.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_82);
    x_83.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_83.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_83.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_83.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_83);
    x_84.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_84.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_84.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_84.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_84);
    x_85.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_85.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_85.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_85.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_85);
    x_86.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_86.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_86.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_86.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_86);
    x_87.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_87.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_87.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_87.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_87);
    x_88.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_88.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_88.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_88.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_88);
    x_89.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_89.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_89.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_89.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_89);
    x_x00247.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00247.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                              CONCAT16(in_stack_fffffffffffff796,
                                                       CONCAT15(in_stack_fffffffffffff795,
                                                                CONCAT14(in_stack_fffffffffffff794,
                                                                         in_stack_fffffffffffff790))
                                                      )),x_x00247);
    if (((bVar3) &&
        ((x_x00248.m_flags._3_1_ = in_stack_fffffffffffff79f,
         x_x00248.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
         bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                   CONCAT16(in_stack_fffffffffffff796,
                                                            CONCAT15(in_stack_fffffffffffff795,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00248), !bVar3 ||
         (x_x00249.m_flags._3_1_ = in_stack_fffffffffffff79f,
         x_x00249.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
         bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                   CONCAT16(in_stack_fffffffffffff796,
                                                            CONCAT15(in_stack_fffffffffffff795,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00249), !bVar3)))
        ) && (((x_x00250.m_flags._3_1_ = in_stack_fffffffffffff79f,
               x_x00250.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
               bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                         CONCAT16(in_stack_fffffffffffff796,
                                                                  CONCAT15(in_stack_fffffffffffff795
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00250), !bVar3 ||
               (x_x00251.m_flags._3_1_ = in_stack_fffffffffffff79f,
               x_x00251.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
               bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                         CONCAT16(in_stack_fffffffffffff796,
                                                                  CONCAT15(in_stack_fffffffffffff795
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00251), !bVar3))
              && (((x_x00252.m_flags._3_1_ = in_stack_fffffffffffff79f,
                   x_x00252.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
                   bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                             CONCAT16(in_stack_fffffffffffff796,
                                                                      CONCAT15(
                                                  in_stack_fffffffffffff795,
                                                  CONCAT14(in_stack_fffffffffffff794,
                                                           in_stack_fffffffffffff790)))),x_x00252),
                   !bVar3 || (x_x00253.m_flags._3_1_ = in_stack_fffffffffffff79f,
                             x_x00253.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
                             bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                                       CONCAT16(
                                                  in_stack_fffffffffffff796,
                                                  CONCAT15(in_stack_fffffffffffff795,
                                                           CONCAT14(in_stack_fffffffffffff794,
                                                                    in_stack_fffffffffffff790)))),
                                                  x_x00253), !bVar3)) &&
                  (x_x00254.m_flags._3_1_ = in_stack_fffffffffffff79f,
                  x_x00254.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
                  bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                            CONCAT16(in_stack_fffffffffffff796,
                                                                     CONCAT15(
                                                  in_stack_fffffffffffff795,
                                                  CONCAT14(in_stack_fffffffffffff794,
                                                           in_stack_fffffffffffff790)))),x_x00254),
                  bVar3)))))) {
      x_x00255.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00255.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                        CONCAT16(in_stack_fffffffffffff796,
                                                 CONCAT15(in_stack_fffffffffffff795,
                                                          CONCAT14(in_stack_fffffffffffff794,
                                                                   in_stack_fffffffffffff790)))),
                       x_x00255);
    }
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_90.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_90.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_90.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_90.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_90);
    break;
  case 0x13:
    x_x00256.m_flags._3_1_ = (bool)in_stack_fffffffffffff79f;
    x_x00256.m_flags._0_3_ = uVar9;
    bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                              CONCAT16(in_stack_fffffffffffff796,
                                                       CONCAT15(in_stack_fffffffffffff795,
                                                                CONCAT14(in_stack_fffffffffffff794,
                                                                         in_stack_fffffffffffff790))
                                                      )),x_x00256);
    if (bVar3) {
      x_x00257.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00257.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                        CONCAT16(in_stack_fffffffffffff796,
                                                 CONCAT15(in_stack_fffffffffffff795,
                                                          CONCAT14(in_stack_fffffffffffff794,
                                                                   in_stack_fffffffffffff790)))),
                       x_x00257);
    }
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_91.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_91.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_91.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_91.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_91);
    x_92.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_92.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_92.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_92.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_92);
    x_93.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_93.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_93.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_93.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_93);
    x_x00258.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00258.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00258);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_94.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_94.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_94.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_94.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_94);
    x_95.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_95.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_95.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_95.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_95);
    x_96.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_96.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_96.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_96.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_96);
    x_97.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_97.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_97.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_97.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_97);
    x_x00259.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00259.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                              CONCAT16(in_stack_fffffffffffff796,
                                                       CONCAT15(in_stack_fffffffffffff795,
                                                                CONCAT14(in_stack_fffffffffffff794,
                                                                         in_stack_fffffffffffff790))
                                                      )),x_x00259);
    if (bVar3) {
      x_98.m_flags._1_1_ = in_stack_fffffffffffff799;
      x_98.m_flags._0_1_ = in_stack_fffffffffffff798;
      x_98.m_flags._2_1_ = in_stack_fffffffffffff79a;
      x_98.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
      Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                       CONCAT16(in_stack_fffffffffffff796,
                                                CONCAT15(in_stack_fffffffffffff795,
                                                         CONCAT14(in_stack_fffffffffffff794,
                                                                  in_stack_fffffffffffff790)))),x_98
                     );
      x_x00260.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00260.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                        CONCAT16(in_stack_fffffffffffff796,
                                                 CONCAT15(in_stack_fffffffffffff795,
                                                          CONCAT14(in_stack_fffffffffffff794,
                                                                   in_stack_fffffffffffff790)))),
                       x_x00260);
    }
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_99.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_99.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_99.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_99.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),x_99);
    x_x00100.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00100.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00100.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00100.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00100);
    x_x00101.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00101.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00101.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00101.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00101);
    x_x00102.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00102.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00102.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00102.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00102);
    x_x00103.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00103.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00103.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00103.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00103);
    x_x00104.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00104.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00104.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00104.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00104);
    x_x00105.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00105.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00105.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00105.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00105);
    x_x00106.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00106.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00106.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00106.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00106);
    x_x00107.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00107.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00107.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00107.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00107);
    x_x00108.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00108.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00108.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00108.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00108);
    x_x00109.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00109.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00109.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00109.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00109);
    break;
  case 0x14:
    x_x00129.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00129.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00129.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00129.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00129);
    x_x00265.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00265.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00265);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00130.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00130.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00130.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00130.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00130);
    x_x00266.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00266.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00266);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00131.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00131.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00131.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00131.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00131);
    x_x00132.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00132.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00132.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00132.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00132);
    x_x00133.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00133.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00133.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00133.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00133);
    x_x00267.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00267.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                              CONCAT16(in_stack_fffffffffffff796,
                                                       CONCAT15(in_stack_fffffffffffff795,
                                                                CONCAT14(in_stack_fffffffffffff794,
                                                                         in_stack_fffffffffffff790))
                                                      )),x_x00267);
    if (bVar3) {
      x_x00134.m_flags._1_1_ = in_stack_fffffffffffff799;
      x_x00134.m_flags._0_1_ = in_stack_fffffffffffff798;
      x_x00134.m_flags._2_1_ = in_stack_fffffffffffff79a;
      x_x00134.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
      Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                       CONCAT16(in_stack_fffffffffffff796,
                                                CONCAT15(in_stack_fffffffffffff795,
                                                         CONCAT14(in_stack_fffffffffffff794,
                                                                  in_stack_fffffffffffff790)))),
                      x_x00134);
      x_x00268.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00268.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                        CONCAT16(in_stack_fffffffffffff796,
                                                 CONCAT15(in_stack_fffffffffffff795,
                                                          CONCAT14(in_stack_fffffffffffff794,
                                                                   in_stack_fffffffffffff790)))),
                       x_x00268);
    }
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00135.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00135.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00135.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00135.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00135);
    x_x00136.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00136.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00136.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00136.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00136);
    x_x00137.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00137.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00137.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00137.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00137);
    x_x00138.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00138.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00138.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00138.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00138);
    x_x00139.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00139.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00139.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00139.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00139);
    x_x00140.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00140.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00140.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00140.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00140);
    x_x00141.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00141.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00141.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00141.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00141);
    x_x00142.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00142.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00142.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00142.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00142);
    x_x00143.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00143.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00143.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00143.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00143);
    x_x00144.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00144.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00144.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00144.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00144);
    x_x00145.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00145.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00145.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00145.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00145);
    break;
  case 0x15:
    x_x00110.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00110.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00110.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00110.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00110);
    x_x00261.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00261.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00261);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00111.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00111.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00111.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00111.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00111);
    x_x00262.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00262.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00262);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00112.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00112.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00112.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00112.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00112);
    x_x00113.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00113.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00113.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00113.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00113);
    x_x00114.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00114.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00114.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00114.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00114);
    x_x00263.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00263.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                              CONCAT16(in_stack_fffffffffffff796,
                                                       CONCAT15(in_stack_fffffffffffff795,
                                                                CONCAT14(in_stack_fffffffffffff794,
                                                                         in_stack_fffffffffffff790))
                                                      )),x_x00263);
    if (bVar3) {
      x_x00115.m_flags._1_1_ = in_stack_fffffffffffff799;
      x_x00115.m_flags._0_1_ = in_stack_fffffffffffff798;
      x_x00115.m_flags._2_1_ = in_stack_fffffffffffff79a;
      x_x00115.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
      Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                       CONCAT16(in_stack_fffffffffffff796,
                                                CONCAT15(in_stack_fffffffffffff795,
                                                         CONCAT14(in_stack_fffffffffffff794,
                                                                  in_stack_fffffffffffff790)))),
                      x_x00115);
      x_x00264.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00264.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                        CONCAT16(in_stack_fffffffffffff796,
                                                 CONCAT15(in_stack_fffffffffffff795,
                                                          CONCAT14(in_stack_fffffffffffff794,
                                                                   in_stack_fffffffffffff790)))),
                       x_x00264);
    }
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00116.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00116.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00116.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00116.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00116);
    x_x00117.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00117.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00117.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00117.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00117);
    x_x00118.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00118.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00118.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00118.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00118);
    x_x00119.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00119.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00119.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00119.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00119);
    x_x00120.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00120.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00120.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00120.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00120);
    x_x00121.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00121.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00121.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00121.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00121);
    x_x00122.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00122.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00122.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00122.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00122);
    x_x00123.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00123.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00123.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00123.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00123);
    x_x00124.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00124.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00124.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00124.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00124);
    x_x00125.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00125.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00125.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00125.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00125);
    x_x00126.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00126.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00126.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00126.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00126);
    x_x00127.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00127.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00127.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00127.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00127);
    x_x00128.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00128.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00128.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00128.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00128);
    break;
  case 0x16:
    x_x00146.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00146.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00146.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00146.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00146);
    x_x00147.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00147.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00147.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00147.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00147);
    x_x00148.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00148.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00148.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00148.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00148);
    x_x00269.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00269.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00269);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00149.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00149.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00149.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00149.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00149);
    x_x00150.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00150.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00150.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00150.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00150);
    x_x00151.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00151.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00151.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00151.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00151);
    x_x00152.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00152.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00152.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00152.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00152);
    x_x00270.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00270.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00270);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00153.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00153.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00153.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00153.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00153);
    x_x00154.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00154.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00154.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00154.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00154);
    x_x00155.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00155.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00155.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00155.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00155);
    x_x00156.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00156.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00156.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00156.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00156);
    x_x00271.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00271.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00271);
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00157.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00157.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00157.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00157.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00157);
    x_x00158.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00158.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00158.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00158.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00158);
    x_x00159.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00159.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00159.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00159.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00159);
    x_x00160.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00160.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00160.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00160.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00160);
    x_x00161.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00161.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00161.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00161.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00161);
    x_x00162.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00162.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00162.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00162.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00162);
    x_x00163.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00163.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00163.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00163.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00163);
    x_x00164.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00164.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00164.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00164.m_flags._3_1_ = uVar6;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00164);
    x_x00165.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00165.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00165.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00165.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00165);
    x_x00166.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00166.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00166.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00166.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00166);
    x_x00167.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00167.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00167.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00167.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00167);
    break;
  case 0x17:
    x_x00168.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00168.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00168.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00168.m_flags._3_1_ = uVar6;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00168);
    x_x00169.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00169.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00169.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00169.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00169);
    x_x00272.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00272.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00272);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00170.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00170.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00170.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00170.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00170);
    x_x00171.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00171.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00171.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00171.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00171);
    x_x00172.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00172.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00172.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00172.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00172);
    x_x00173.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00173.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00173.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00173.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00173);
    x_x00174.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00174.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00174.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00174.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00174);
    x_x00175.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00175.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00175.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00175.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00175);
    x_x00176.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00176.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00176.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00176.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00176);
    x_x00177.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00177.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00177.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00177.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00177);
    x_x00178.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00178.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00178.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00178.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00178);
    x_x00273.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00273.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                      CONCAT16(in_stack_fffffffffffff796,
                                               CONCAT15(in_stack_fffffffffffff795,
                                                        CONCAT14(in_stack_fffffffffffff794,
                                                                 in_stack_fffffffffffff790)))),
                     x_x00273);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00179.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00179.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00179.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00179.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00179);
    x_x00180.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00180.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00180.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00180.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00180);
    x_x00181.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00181.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00181.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00181.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00181);
    x_x00182.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00182.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00182.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00182.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00182);
    x_x00183.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00183.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00183.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00183.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00183);
    x_x00274.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00274.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                              CONCAT16(in_stack_fffffffffffff796,
                                                       CONCAT15(in_stack_fffffffffffff795,
                                                                CONCAT14(in_stack_fffffffffffff794,
                                                                         in_stack_fffffffffffff790))
                                                      )),x_x00274);
    if (!bVar3) {
      x_x00275.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00275.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                        CONCAT16(in_stack_fffffffffffff796,
                                                 CONCAT15(in_stack_fffffffffffff795,
                                                          CONCAT14(in_stack_fffffffffffff794,
                                                                   in_stack_fffffffffffff790)))),
                       x_x00275);
    }
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00184.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00184.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00184.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00184.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00184);
    x_x00185.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00185.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00185.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00185.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00185);
    x_x00186.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00186.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00186.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00186.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00186);
    x_x00187.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00187.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00187.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00187.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00187);
    x_x00276.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00276.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                              CONCAT16(in_stack_fffffffffffff796,
                                                       CONCAT15(in_stack_fffffffffffff795,
                                                                CONCAT14(in_stack_fffffffffffff794,
                                                                         in_stack_fffffffffffff790))
                                                      )),x_x00276);
    if (!bVar3) {
      x_x00277.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00277.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                        CONCAT16(in_stack_fffffffffffff796,
                                                 CONCAT15(in_stack_fffffffffffff795,
                                                          CONCAT14(in_stack_fffffffffffff794,
                                                                   in_stack_fffffffffffff790)))),
                       x_x00277);
    }
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00188.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00188.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00188.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00188.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00188);
    x_x00189.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00189.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00189.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00189.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00189);
    x_x00190.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00190.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00190.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00190.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00190);
    x_x00191.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00191.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00191.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00191.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00191);
    x_x00278.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00278.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                              CONCAT16(in_stack_fffffffffffff796,
                                                       CONCAT15(in_stack_fffffffffffff795,
                                                                CONCAT14(in_stack_fffffffffffff794,
                                                                         in_stack_fffffffffffff790))
                                                      )),x_x00278);
    if (bVar3) {
      x_x00192.m_flags._1_1_ = in_stack_fffffffffffff799;
      x_x00192.m_flags._0_1_ = in_stack_fffffffffffff798;
      x_x00192.m_flags._2_1_ = in_stack_fffffffffffff79a;
      x_x00192.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
      Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                       CONCAT16(in_stack_fffffffffffff796,
                                                CONCAT15(in_stack_fffffffffffff795,
                                                         CONCAT14(in_stack_fffffffffffff794,
                                                                  in_stack_fffffffffffff790)))),
                      x_x00192);
      x_x00193.m_flags._1_1_ = in_stack_fffffffffffff799;
      x_x00193.m_flags._0_1_ = in_stack_fffffffffffff798;
      x_x00193.m_flags._2_1_ = in_stack_fffffffffffff79a;
      x_x00193.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
      Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                       CONCAT16(in_stack_fffffffffffff796,
                                                CONCAT15(in_stack_fffffffffffff795,
                                                         CONCAT14(in_stack_fffffffffffff794,
                                                                  in_stack_fffffffffffff790)))),
                      x_x00193);
      x_x00279.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00279.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                        CONCAT16(in_stack_fffffffffffff796,
                                                 CONCAT15(in_stack_fffffffffffff795,
                                                          CONCAT14(in_stack_fffffffffffff794,
                                                                   in_stack_fffffffffffff790)))),
                       x_x00279);
    }
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00194.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00194.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00194.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00194.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00194);
    x_x00195.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00195.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00195.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00195.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00195);
    x_x00196.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00196.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00196.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00196.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00196);
    x_x00197.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00197.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00197.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00197.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00197);
    x_x00198.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00198.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00198.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00198.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00198);
    x_x00199.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00199.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00199.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00199.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00199);
    x_x00200.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00200.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00200.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00200.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00200);
    x_x00201.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00201.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00201.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00201.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00201);
    x_x00202.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00202.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00202.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00202.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00202);
    x_x00203.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00203.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00203.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00203.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00203);
    x_x00204.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00204.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00204.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00204.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00204);
    x_x00205.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00205.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00205.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00205.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
    Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00205);
    x_x00280.m_flags._3_1_ = in_stack_fffffffffffff79f;
    x_x00280.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
    bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                              CONCAT16(in_stack_fffffffffffff796,
                                                       CONCAT15(in_stack_fffffffffffff795,
                                                                CONCAT14(in_stack_fffffffffffff794,
                                                                         in_stack_fffffffffffff790))
                                                      )),x_x00280);
    if ((((bVar3) &&
         ((x_x00281.m_flags._3_1_ = in_stack_fffffffffffff79f,
          x_x00281.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
          bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                    CONCAT16(in_stack_fffffffffffff796,
                                                             CONCAT15(in_stack_fffffffffffff795,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00281), !bVar3 ||
          (x_x00282.m_flags._3_1_ = in_stack_fffffffffffff79f,
          x_x00282.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
          bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                    CONCAT16(in_stack_fffffffffffff796,
                                                             CONCAT15(in_stack_fffffffffffff795,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00282), !bVar3)))
         ) && ((x_x00283.m_flags._3_1_ = in_stack_fffffffffffff79f,
               x_x00283.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
               bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                         CONCAT16(in_stack_fffffffffffff796,
                                                                  CONCAT15(in_stack_fffffffffffff795
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00283), !bVar3 ||
               (x_x00284.m_flags._3_1_ = in_stack_fffffffffffff79f,
               x_x00284.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
               bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                         CONCAT16(in_stack_fffffffffffff796,
                                                                  CONCAT15(in_stack_fffffffffffff795
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00284), !bVar3)))
        ) && (((x_x00285.m_flags._3_1_ = in_stack_fffffffffffff79f,
               x_x00285.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
               bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                         CONCAT16(in_stack_fffffffffffff796,
                                                                  CONCAT15(in_stack_fffffffffffff795
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00285), !bVar3 ||
               (x_x00286.m_flags._3_1_ = in_stack_fffffffffffff79f,
               x_x00286.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
               bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                         CONCAT16(in_stack_fffffffffffff796,
                                                                  CONCAT15(in_stack_fffffffffffff795
                                                                           ,CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00286), !bVar3))
              && (x_x00287.m_flags._3_1_ = in_stack_fffffffffffff79f,
                 x_x00287.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8),
                 bVar3 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                           CONCAT16(in_stack_fffffffffffff796,
                                                                    CONCAT15(
                                                  in_stack_fffffffffffff795,
                                                  CONCAT14(in_stack_fffffffffffff794,
                                                           in_stack_fffffffffffff790)))),x_x00287),
                 bVar3)))) {
      x_x00288.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00288.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                        CONCAT16(in_stack_fffffffffffff796,
                                                 CONCAT15(in_stack_fffffffffffff795,
                                                          CONCAT14(in_stack_fffffffffffff794,
                                                                   in_stack_fffffffffffff790)))),
                       x_x00288);
    }
    uVar6 = (undefined1)in_stack_fffffffffffff79b;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00206.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00206.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00206.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00206.m_flags._3_1_ = uVar6;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(in_stack_fffffffffffff796,
                                                          CONCAT15(in_stack_fffffffffffff795,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00206);
    break;
  case 0x18:
    bVar3 = true;
    bVar2 = true;
    local_7c8 = 0;
    for (local_7d0 = 0;
        sVar5 = std::vector<miniscript::Type,_std::allocator<miniscript::Type>_>::size
                          ((vector<miniscript::Type,_std::allocator<miniscript::Type>_> *)
                           CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788)),
        local_7d0 < sVar5; local_7d0 = local_7d0 + 1) {
      std::vector<miniscript::Type,_std::allocator<miniscript::Type>_>::operator[]
                ((vector<miniscript::Type,_std::allocator<miniscript::Type>_> *)
                 CONCAT17(in_stack_fffffffffffff79f,
                          CONCAT43(in_stack_fffffffffffff79b,
                                   CONCAT12(in_stack_fffffffffffff79a,
                                            CONCAT11(in_stack_fffffffffffff799,
                                                     in_stack_fffffffffffff798)))),
                 CONCAT17(in_stack_fffffffffffff797,
                          CONCAT16(in_stack_fffffffffffff796,
                                   CONCAT15(in_stack_fffffffffffff795,
                                            CONCAT14(in_stack_fffffffffffff794,
                                                     in_stack_fffffffffffff790)))));
      if (local_7d0 == 0) {
        in_stack_fffffffffffff7a0 = &ComputeType::BDU;
      }
      else {
        in_stack_fffffffffffff7a0 = &ComputeType::WDU;
      }
      x_x00289.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00289.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                CONCAT16(in_stack_fffffffffffff796,
                                                         CONCAT15(in_stack_fffffffffffff795,
                                                                  CONCAT14(in_stack_fffffffffffff794
                                                                           ,
                                                  in_stack_fffffffffffff790)))),x_x00289);
      if (!bVar4) {
        local_430 = 0;
        goto LAB_00f05b4a;
      }
      x_x00290.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00290.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                CONCAT16(in_stack_fffffffffffff796,
                                                         CONCAT15(in_stack_fffffffffffff795,
                                                                  CONCAT14(in_stack_fffffffffffff794
                                                                           ,
                                                  in_stack_fffffffffffff790)))),x_x00290);
      if (!bVar4) {
        bVar3 = false;
      }
      x_x00291.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00291.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                CONCAT16(in_stack_fffffffffffff796,
                                                         CONCAT15(in_stack_fffffffffffff795,
                                                                  CONCAT14(in_stack_fffffffffffff794
                                                                           ,
                                                  in_stack_fffffffffffff790)))),x_x00291);
      if (!bVar4) {
        bVar2 = false;
      }
      x_x00292.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00292.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                CONCAT16(in_stack_fffffffffffff796,
                                                         CONCAT15(in_stack_fffffffffffff795,
                                                                  CONCAT14(in_stack_fffffffffffff794
                                                                           ,
                                                  in_stack_fffffffffffff790)))),x_x00292);
      if (bVar4) {
        local_7c8 = local_7c8 + 1;
      }
      x_x00293.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00293.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
      bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                CONCAT16(in_stack_fffffffffffff796,
                                                         CONCAT15(in_stack_fffffffffffff795,
                                                                  CONCAT14(in_stack_fffffffffffff794
                                                                           ,
                                                  in_stack_fffffffffffff790)))),x_x00293);
      if (bVar4) {
        uVar6 = (undefined1)in_stack_fffffffffffff79b;
        uVar10 = 0;
      }
      else {
        x_x00294.m_flags._3_1_ = in_stack_fffffffffffff79f;
        x_x00294.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
        bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                  CONCAT16(in_stack_fffffffffffff796,
                                                           CONCAT15(in_stack_fffffffffffff795,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00294);
        uVar10 = 2;
        if (bVar4) {
          uVar10 = 1;
        }
        uVar6 = (undefined1)in_stack_fffffffffffff79b;
      }
      in_stack_fffffffffffff79f = 0;
      x_x00207.m_flags._1_1_ = in_stack_fffffffffffff799;
      x_x00207.m_flags._0_1_ = in_stack_fffffffffffff798;
      x_x00207.m_flags._2_1_ = in_stack_fffffffffffff79a;
      x_x00207.m_flags._3_1_ = uVar6;
      Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                       CONCAT16(in_stack_fffffffffffff796,
                                                CONCAT15(in_stack_fffffffffffff795,
                                                         CONCAT14(in_stack_fffffffffffff794,
                                                                  in_stack_fffffffffffff790)))),
                      x_x00207);
      x_x00208.m_flags._1_1_ = in_stack_fffffffffffff799;
      x_x00208.m_flags._0_1_ = in_stack_fffffffffffff798;
      x_x00208.m_flags._2_1_ = in_stack_fffffffffffff79a;
      x_x00208.m_flags._3_1_ = uVar6;
      Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                       CONCAT16(in_stack_fffffffffffff796,
                                                CONCAT15(in_stack_fffffffffffff795,
                                                         CONCAT14(in_stack_fffffffffffff794,
                                                                  in_stack_fffffffffffff790)))),
                      x_x00208);
      x_x00209.m_flags._1_1_ = in_stack_fffffffffffff799;
      x_x00209.m_flags._0_1_ = in_stack_fffffffffffff798;
      x_x00209.m_flags._2_1_ = in_stack_fffffffffffff79a;
      x_x00209.m_flags._3_1_ = uVar6;
      Type::operator&((Type *)CONCAT17(in_stack_fffffffffffff797,
                                       CONCAT16(in_stack_fffffffffffff796,
                                                CONCAT15(in_stack_fffffffffffff795,
                                                         CONCAT14(in_stack_fffffffffffff794,
                                                                  in_stack_fffffffffffff790)))),
                      x_x00209);
      x_x00295.m_flags._3_1_ = in_stack_fffffffffffff79f;
      x_x00295.m_flags._0_3_ = uVar10;
      bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                CONCAT16(in_stack_fffffffffffff796,
                                                         CONCAT15(in_stack_fffffffffffff795,
                                                                  CONCAT14(in_stack_fffffffffffff794
                                                                           ,
                                                  in_stack_fffffffffffff790)))),x_x00295);
      in_stack_fffffffffffff79b = (uint)uVar10 << 8;
      if (bVar4) {
        in_stack_fffffffffffff79a = 1;
        if ((1 < in_R9D) &&
           (in_stack_fffffffffffff799 = 0, in_stack_fffffffffffff79a = in_stack_fffffffffffff799,
           1 < in_R9D)) {
          x_x00296.m_flags._3_1_ = in_stack_fffffffffffff79f;
          x_x00296.m_flags._0_3_ = uVar10;
          bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                    CONCAT16(in_stack_fffffffffffff796,
                                                             CONCAT15(in_stack_fffffffffffff795,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00296);
          if (bVar4) {
            x_x00297.m_flags._3_1_ = in_stack_fffffffffffff79f;
            x_x00297.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
            bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                      CONCAT16(in_stack_fffffffffffff796,
                                                               CONCAT15(in_stack_fffffffffffff795,
                                                                        CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00297);
            in_stack_fffffffffffff798 = true;
            if (!bVar4) goto LAB_00f057d4;
          }
          else {
LAB_00f057d4:
            x_x00298.m_flags._3_1_ = in_stack_fffffffffffff79f;
            x_x00298.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
            bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                      CONCAT16(in_stack_fffffffffffff796,
                                                               CONCAT15(in_stack_fffffffffffff795,
                                                                        CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00298);
            if (bVar4) {
              x_x00299.m_flags._3_1_ = in_stack_fffffffffffff79f;
              x_x00299.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
              bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                        CONCAT16(in_stack_fffffffffffff796,
                                                                 CONCAT15(in_stack_fffffffffffff795,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00299);
              in_stack_fffffffffffff798 = true;
              if (bVar4) goto LAB_00f058af;
            }
            x_x00300.m_flags._3_1_ = in_stack_fffffffffffff79f;
            x_x00300.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
            bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                      CONCAT16(in_stack_fffffffffffff796,
                                                               CONCAT15(in_stack_fffffffffffff795,
                                                                        CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00300);
            if (bVar4) {
              x_x00301.m_flags._3_1_ = in_stack_fffffffffffff79f;
              x_x00301.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
              bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                        CONCAT16(in_stack_fffffffffffff796,
                                                                 CONCAT15(in_stack_fffffffffffff795,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00301);
              in_stack_fffffffffffff798 = true;
              if (bVar4) goto LAB_00f058af;
            }
            x_x00302.m_flags._3_1_ = in_stack_fffffffffffff79f;
            x_x00302.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
            bVar4 = Type::operator<<((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                      CONCAT16(in_stack_fffffffffffff796,
                                                               CONCAT15(in_stack_fffffffffffff795,
                                                                        CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00302);
            in_stack_fffffffffffff797 = false;
            in_stack_fffffffffffff798 = in_stack_fffffffffffff797;
            if (bVar4) {
              x_x00303.m_flags._3_1_ = in_stack_fffffffffffff79f;
              x_x00303.m_flags._0_3_ = (int3)((uint)in_stack_fffffffffffff79b >> 8);
              in_stack_fffffffffffff797 =
                   Type::operator<<((Type *)(ulong)CONCAT16(in_stack_fffffffffffff796,
                                                            CONCAT15(in_stack_fffffffffffff795,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790))),x_x00303);
              in_stack_fffffffffffff798 = in_stack_fffffffffffff797;
            }
          }
LAB_00f058af:
          in_stack_fffffffffffff799 = in_stack_fffffffffffff798 ^ 0xff;
          in_stack_fffffffffffff79a = in_stack_fffffffffffff799;
        }
        in_stack_fffffffffffff79b =
             CONCAT31((int3)((uint)in_stack_fffffffffffff79b >> 8),in_stack_fffffffffffff79a);
      }
      Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
      x_x00210.m_flags._1_1_ = in_stack_fffffffffffff799;
      x_x00210.m_flags._0_1_ = in_stack_fffffffffffff798;
      x_x00210.m_flags._2_1_ = in_stack_fffffffffffff79a;
      x_x00210.m_flags._3_1_ = (char)in_stack_fffffffffffff79b;
      Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                       CONCAT16(in_stack_fffffffffffff796,
                                                CONCAT15(in_stack_fffffffffffff795,
                                                         CONCAT14(in_stack_fffffffffffff794,
                                                                  in_stack_fffffffffffff790)))),
                      x_x00210);
    }
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00211.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00211.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00211.m_flags._2_1_ = in_stack_fffffffffffff79a;
    uVar8 = (undefined1)in_stack_fffffffffffff79b;
    x_x00211.m_flags._3_1_ = uVar8;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00211);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00212.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00212.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00212.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00212.m_flags._3_1_ = uVar8;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(in_stack_fffffffffffff796,
                                              CONCAT15(in_stack_fffffffffffff795,
                                                       CONCAT14(in_stack_fffffffffffff794,
                                                                in_stack_fffffffffffff790)))),
                    x_x00212);
    uVar7 = bVar3 && local_7c8 == in_stack_00000010;
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00213.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00213.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00213.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00213.m_flags._3_1_ = uVar8;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffff795,
                                                             CONCAT14(in_stack_fffffffffffff794,
                                                                      in_stack_fffffffffffff790)))),
                    x_x00213);
    uVar6 = false;
    if ((bVar3) && (uVar6 = false, bVar2)) {
      uVar6 = in_stack_00000010 - in_R9D <= (ulong)local_7c8;
    }
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00214.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00214.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00214.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00214.m_flags._3_1_ = uVar8;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00214);
    Type::If(in_stack_fffffffffffff7a0,(bool)in_stack_fffffffffffff79f);
    x_x00215.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00215.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00215.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00215.m_flags._3_1_ = uVar8;
    Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                     CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00215);
    x_x00216.m_flags._1_1_ = in_stack_fffffffffffff799;
    x_x00216.m_flags._0_1_ = in_stack_fffffffffffff798;
    x_x00216.m_flags._2_1_ = in_stack_fffffffffffff79a;
    x_x00216.m_flags._3_1_ = uVar8;
    local_430 = (uint32_t)
                Type::operator|((Type *)CONCAT17(in_stack_fffffffffffff797,
                                                 CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(
                                                  in_stack_fffffffffffff794,
                                                  in_stack_fffffffffffff790)))),x_x00216);
    break;
  case 0x19:
    local_430 = 0x41bc1;
    break;
  case 0x1a:
    local_430 = 0x41b81;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.cpp"
                  ,0x103,
                  "Type miniscript::internal::ComputeType(Fragment, Type, Type, Type, const std::vector<Type> &, uint32_t, size_t, size_t, size_t, MiniscriptContext)"
                 );
  }
LAB_00f05b4a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Type)local_430;
  }
  __stack_chk_fail();
}

Assistant:

Type ComputeType(Fragment fragment, Type x, Type y, Type z, const std::vector<Type>& sub_types, uint32_t k,
                 size_t data_size, size_t n_subs, size_t n_keys, MiniscriptContext ms_ctx) {
    // Sanity check on data
    if (fragment == Fragment::SHA256 || fragment == Fragment::HASH256) {
        assert(data_size == 32);
    } else if (fragment == Fragment::RIPEMD160 || fragment == Fragment::HASH160) {
        assert(data_size == 20);
    } else {
        assert(data_size == 0);
    }
    // Sanity check on k
    if (fragment == Fragment::OLDER || fragment == Fragment::AFTER) {
        assert(k >= 1 && k < 0x80000000UL);
    } else if (fragment == Fragment::MULTI || fragment == Fragment::MULTI_A) {
        assert(k >= 1 && k <= n_keys);
    } else if (fragment == Fragment::THRESH) {
        assert(k >= 1 && k <= n_subs);
    } else {
        assert(k == 0);
    }
    // Sanity check on subs
    if (fragment == Fragment::AND_V || fragment == Fragment::AND_B || fragment == Fragment::OR_B ||
        fragment == Fragment::OR_C || fragment == Fragment::OR_I || fragment == Fragment::OR_D) {
        assert(n_subs == 2);
    } else if (fragment == Fragment::ANDOR) {
        assert(n_subs == 3);
    } else if (fragment == Fragment::WRAP_A || fragment == Fragment::WRAP_S || fragment == Fragment::WRAP_C ||
               fragment == Fragment::WRAP_D || fragment == Fragment::WRAP_V || fragment == Fragment::WRAP_J ||
               fragment == Fragment::WRAP_N) {
        assert(n_subs == 1);
    } else if (fragment != Fragment::THRESH) {
        assert(n_subs == 0);
    }
    // Sanity check on keys
    if (fragment == Fragment::PK_K || fragment == Fragment::PK_H) {
        assert(n_keys == 1);
    } else if (fragment == Fragment::MULTI) {
        assert(n_keys >= 1 && n_keys <= MAX_PUBKEYS_PER_MULTISIG);
        assert(!IsTapscript(ms_ctx));
    } else if (fragment == Fragment::MULTI_A) {
        assert(n_keys >= 1 && n_keys <= MAX_PUBKEYS_PER_MULTI_A);
        assert(IsTapscript(ms_ctx));
    } else {
        assert(n_keys == 0);
    }

    // Below is the per-fragment logic for computing the expression types.
    // It heavily relies on Type's << operator (where "X << a_mst" means
    // "X has all properties listed in a").
    switch (fragment) {
        case Fragment::PK_K: return "Konudemsxk"_mst;
        case Fragment::PK_H: return "Knudemsxk"_mst;
        case Fragment::OLDER: return
            "g"_mst.If(k & CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG) |
            "h"_mst.If(!(k & CTxIn::SEQUENCE_LOCKTIME_TYPE_FLAG)) |
            "Bzfmxk"_mst;
        case Fragment::AFTER: return
            "i"_mst.If(k >= LOCKTIME_THRESHOLD) |
            "j"_mst.If(k < LOCKTIME_THRESHOLD) |
            "Bzfmxk"_mst;
        case Fragment::SHA256: return "Bonudmk"_mst;
        case Fragment::RIPEMD160: return "Bonudmk"_mst;
        case Fragment::HASH256: return "Bonudmk"_mst;
        case Fragment::HASH160: return "Bonudmk"_mst;
        case Fragment::JUST_1: return "Bzufmxk"_mst;
        case Fragment::JUST_0: return "Bzudemsxk"_mst;
        case Fragment::WRAP_A: return
            "W"_mst.If(x << "B"_mst) | // W=B_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "udfems"_mst) | // u=u_x, d=d_x, f=f_x, e=e_x, m=m_x, s=s_x
            "x"_mst; // x
        case Fragment::WRAP_S: return
            "W"_mst.If(x << "Bo"_mst) | // W=B_x*o_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "udfemsx"_mst); // u=u_x, d=d_x, f=f_x, e=e_x, m=m_x, s=s_x, x=x_x
        case Fragment::WRAP_C: return
            "B"_mst.If(x << "K"_mst) | // B=K_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "ondfem"_mst) | // o=o_x, n=n_x, d=d_x, f=f_x, e=e_x, m=m_x
            "us"_mst; // u, s
        case Fragment::WRAP_D: return
            "B"_mst.If(x << "Vz"_mst) | // B=V_x*z_x
            "o"_mst.If(x << "z"_mst) | // o=z_x
            "e"_mst.If(x << "f"_mst) | // e=f_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "ms"_mst) | // m=m_x, s=s_x
            // NOTE: 'd:' is 'u' under Tapscript but not P2WSH as MINIMALIF is only a policy rule there.
            "u"_mst.If(IsTapscript(ms_ctx)) |
            "ndx"_mst; // n, d, x
        case Fragment::WRAP_V: return
            "V"_mst.If(x << "B"_mst) | // V=B_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "zonms"_mst) | // z=z_x, o=o_x, n=n_x, m=m_x, s=s_x
            "fx"_mst; // f, x
        case Fragment::WRAP_J: return
            "B"_mst.If(x << "Bn"_mst) | // B=B_x*n_x
            "e"_mst.If(x << "f"_mst) | // e=f_x
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "oums"_mst) | // o=o_x, u=u_x, m=m_x, s=s_x
            "ndx"_mst; // n, d, x
        case Fragment::WRAP_N: return
            (x & "ghijk"_mst) | // g=g_x, h=h_x, i=i_x, j=j_x, k=k_x
            (x & "Bzondfems"_mst) | // B=B_x, z=z_x, o=o_x, n=n_x, d=d_x, f=f_x, e=e_x, m=m_x, s=s_x
            "ux"_mst; // u, x
        case Fragment::AND_V: return
            (y & "KVB"_mst).If(x << "V"_mst) | // B=V_x*B_y, V=V_x*V_y, K=V_x*K_y
            (x & "n"_mst) | (y & "n"_mst).If(x << "z"_mst) | // n=n_x+z_x*n_y
            ((x | y) & "o"_mst).If((x | y) << "z"_mst) | // o=o_x*z_y+z_x*o_y
            (x & y & "dmz"_mst) | // d=d_x*d_y, m=m_x*m_y, z=z_x*z_y
            ((x | y) & "s"_mst) | // s=s_x+s_y
            "f"_mst.If((y << "f"_mst) || (x << "s"_mst)) | // f=f_y+s_x
            (y & "ux"_mst) | // u=u_y, x=x_y
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            "k"_mst.If(((x & y) << "k"_mst) &&
                !(((x << "g"_mst) && (y << "h"_mst)) ||
                ((x << "h"_mst) && (y << "g"_mst)) ||
                ((x << "i"_mst) && (y << "j"_mst)) ||
                ((x << "j"_mst) && (y << "i"_mst)))); // k=k_x*k_y*!(g_x*h_y + h_x*g_y + i_x*j_y + j_x*i_y)
        case Fragment::AND_B: return
            (x & "B"_mst).If(y << "W"_mst) | // B=B_x*W_y
            ((x | y) & "o"_mst).If((x | y) << "z"_mst) | // o=o_x*z_y+z_x*o_y
            (x & "n"_mst) | (y & "n"_mst).If(x << "z"_mst) | // n=n_x+z_x*n_y
            (x & y & "e"_mst).If((x & y) << "s"_mst) | // e=e_x*e_y*s_x*s_y
            (x & y & "dzm"_mst) | // d=d_x*d_y, z=z_x*z_y, m=m_x*m_y
            "f"_mst.If(((x & y) << "f"_mst) || (x << "sf"_mst) || (y << "sf"_mst)) | // f=f_x*f_y + f_x*s_x + f_y*s_y
            ((x | y) & "s"_mst) | // s=s_x+s_y
            "ux"_mst | // u, x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            "k"_mst.If(((x & y) << "k"_mst) &&
                !(((x << "g"_mst) && (y << "h"_mst)) ||
                ((x << "h"_mst) && (y << "g"_mst)) ||
                ((x << "i"_mst) && (y << "j"_mst)) ||
                ((x << "j"_mst) && (y << "i"_mst)))); // k=k_x*k_y*!(g_x*h_y + h_x*g_y + i_x*j_y + j_x*i_y)
        case Fragment::OR_B: return
            "B"_mst.If(x << "Bd"_mst && y << "Wd"_mst) | // B=B_x*d_x*W_x*d_y
            ((x | y) & "o"_mst).If((x | y) << "z"_mst) | // o=o_x*z_y+z_x*o_y
            (x & y & "m"_mst).If((x | y) << "s"_mst && (x & y) << "e"_mst) | // m=m_x*m_y*e_x*e_y*(s_x+s_y)
            (x & y & "zse"_mst) | // z=z_x*z_y, s=s_x*s_y, e=e_x*e_y
            "dux"_mst | // d, u, x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            (x & y & "k"_mst); // k=k_x*k_y
        case Fragment::OR_D: return
            (y & "B"_mst).If(x << "Bdu"_mst) | // B=B_y*B_x*d_x*u_x
            (x & "o"_mst).If(y << "z"_mst) | // o=o_x*z_y
            (x & y & "m"_mst).If(x << "e"_mst && (x | y) << "s"_mst) | // m=m_x*m_y*e_x*(s_x+s_y)
            (x & y & "zs"_mst) | // z=z_x*z_y, s=s_x*s_y
            (y & "ufde"_mst) | // u=u_y, f=f_y, d=d_y, e=e_y
            "x"_mst | // x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            (x & y & "k"_mst); // k=k_x*k_y
        case Fragment::OR_C: return
            (y & "V"_mst).If(x << "Bdu"_mst) | // V=V_y*B_x*u_x*d_x
            (x & "o"_mst).If(y << "z"_mst) | // o=o_x*z_y
            (x & y & "m"_mst).If(x << "e"_mst && (x | y) << "s"_mst) | // m=m_x*m_y*e_x*(s_x+s_y)
            (x & y & "zs"_mst) | // z=z_x*z_y, s=s_x*s_y
            "fx"_mst | // f, x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            (x & y & "k"_mst); // k=k_x*k_y
        case Fragment::OR_I: return
            (x & y & "VBKufs"_mst) | // V=V_x*V_y, B=B_x*B_y, K=K_x*K_y, u=u_x*u_y, f=f_x*f_y, s=s_x*s_y
            "o"_mst.If((x & y) << "z"_mst) | // o=z_x*z_y
            ((x | y) & "e"_mst).If((x | y) << "f"_mst) | // e=e_x*f_y+f_x*e_y
            (x & y & "m"_mst).If((x | y) << "s"_mst) | // m=m_x*m_y*(s_x+s_y)
            ((x | y) & "d"_mst) | // d=d_x+d_y
            "x"_mst | // x
            ((x | y) & "ghij"_mst) | // g=g_x+g_y, h=h_x+h_y, i=i_x+i_y, j=j_x+j_y
            (x & y & "k"_mst); // k=k_x*k_y
        case Fragment::ANDOR: return
            (y & z & "BKV"_mst).If(x << "Bdu"_mst) | // B=B_x*d_x*u_x*B_y*B_z, K=B_x*d_x*u_x*K_y*K_z, V=B_x*d_x*u_x*V_y*V_z
            (x & y & z & "z"_mst) | // z=z_x*z_y*z_z
            ((x | (y & z)) & "o"_mst).If((x | (y & z)) << "z"_mst) | // o=o_x*z_y*z_z+z_x*o_y*o_z
            (y & z & "u"_mst) | // u=u_y*u_z
            (z & "f"_mst).If((x << "s"_mst) || (y << "f"_mst)) | // f=(s_x+f_y)*f_z
            (z & "d"_mst) | // d=d_z
            (z & "e"_mst).If(x << "s"_mst || y << "f"_mst) | // e=e_z*(s_x+f_y)
            (x & y & z & "m"_mst).If(x << "e"_mst && (x | y | z) << "s"_mst) | // m=m_x*m_y*m_z*e_x*(s_x+s_y+s_z)
            (z & (x | y) & "s"_mst) | // s=s_z*(s_x+s_y)
            "x"_mst | // x
            ((x | y | z) & "ghij"_mst) | // g=g_x+g_y+g_z, h=h_x+h_y+h_z, i=i_x+i_y+i_z, j=j_x+j_y_j_z
            "k"_mst.If(((x & y & z) << "k"_mst) &&
                !(((x << "g"_mst) && (y << "h"_mst)) ||
                ((x << "h"_mst) && (y << "g"_mst)) ||
                ((x << "i"_mst) && (y << "j"_mst)) ||
                ((x << "j"_mst) && (y << "i"_mst)))); // k=k_x*k_y*k_z* !(g_x*h_y + h_x*g_y + i_x*j_y + j_x*i_y)
        case Fragment::MULTI: {
            return "Bnudemsk"_mst;
        }
        case Fragment::MULTI_A: {
            return "Budemsk"_mst;
        }
        case Fragment::THRESH: {
            bool all_e = true;
            bool all_m = true;
            uint32_t args = 0;
            uint32_t num_s = 0;
            Type acc_tl = "k"_mst;
            for (size_t i = 0; i < sub_types.size(); ++i) {
                Type t = sub_types[i];
                static constexpr auto WDU{"Wdu"_mst}, BDU{"Bdu"_mst};
                if (!(t << (i ? WDU : BDU))) return ""_mst; // Require Bdu, Wdu, Wdu, ...
                if (!(t << "e"_mst)) all_e = false;
                if (!(t << "m"_mst)) all_m = false;
                if (t << "s"_mst) num_s += 1;
                args += (t << "z"_mst) ? 0 : (t << "o"_mst) ? 1 : 2;
                acc_tl = ((acc_tl | t) & "ghij"_mst) |
                    // Thresh contains a combination of timelocks if it has threshold > 1 and
                    // it contains two different children that have different types of timelocks
                    // Note how if any of the children don't have "k", the parent also does not have "k"
                    "k"_mst.If(((acc_tl & t) << "k"_mst) && ((k <= 1) ||
                        ((k > 1) && !(((acc_tl << "g"_mst) && (t << "h"_mst)) ||
                        ((acc_tl << "h"_mst) && (t << "g"_mst)) ||
                        ((acc_tl << "i"_mst) && (t << "j"_mst)) ||
                        ((acc_tl << "j"_mst) && (t << "i"_mst))))));
            }
            return "Bdu"_mst |
                   "z"_mst.If(args == 0) | // z=all z
                   "o"_mst.If(args == 1) | // o=all z except one o
                   "e"_mst.If(all_e && num_s == n_subs) | // e=all e and all s
                   "m"_mst.If(all_e && all_m && num_s >= n_subs - k) | // m=all e, >=(n-k) s
                   "s"_mst.If(num_s >= n_subs - k + 1) |  // s= >=(n-k+1) s
                   acc_tl; // timelock info
            }
    }
    assert(false);
}